

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O1

void test_given_mode<std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::pair<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>>,true,gnuplotio::Mode2D>
               (ostream *log_fh,ulong *header,undefined8 arg)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  string fn_prefix;
  string modename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  char *local_d0;
  long local_c8;
  undefined4 local_c0;
  undefined2 uStack_bc;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_d0 = (char *)&local_c0;
  local_c0 = 0x65646f4d;
  uStack_bc = 0x4432;
  local_c8 = 6;
  uStack_ba = 0;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,basedir_abi_cxx11_._M_dataplus._M_p,
             basedir_abi_cxx11_._M_dataplus._M_p + basedir_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_70);
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_70,*header);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_100 = *plVar3;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_120 = *plVar3;
    lStack_118 = plVar1[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*plVar1;
  }
  local_128 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*plVar1;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(log_fh,"* ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(log_fh,local_d0,local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,local_f0,local_e8 + (long)local_f0);
  std::__cxx11::string::append((char *)local_90);
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"record","");
  gnuplotio::Gnuplot::
  binaryFile<std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::pair<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>>,gnuplotio::Mode2D>
            (&local_130,&gp,arg,local_90,&local_110);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_130,local_128);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_f0,local_e8 + (long)local_f0);
  std::__cxx11::string::append((char *)local_b0);
  gnuplotio::Gnuplot::
  file<std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::pair<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>>,gnuplotio::Mode2D>
            (local_50,&gp,arg,local_b0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != (char *)&local_c0) {
    operator_delete(local_d0,CONCAT17(uStack_b9,CONCAT16(uStack_ba,CONCAT24(uStack_bc,local_c0))) +
                             1);
  }
  return;
}

Assistant:

void test_given_mode(
    std::ostream &log_fh, std::string header, const T &arg, ArrayMode
) {
    if constexpr (DoBinary) {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " -> "
            << gp.binaryFile(arg, fn_prefix+".bin", "record", ArrayMode()) << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    } else {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " (skipped binary) " << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    }
}